

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_1U>::resample
          (ImageT<unsigned_char,_1U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  uint uVar1;
  undefined8 uVar2;
  Color *pCVar3;
  uint uVar4;
  _Head_base<0UL,_basisu::Resampler_*,_false> this_00;
  _Head_base<0UL,_Image_*,_false> _Var5;
  char cVar6;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 aVar7;
  uint uVar8;
  ImageT<unsigned_char,_1U> *this_01;
  Resampler *this_02;
  long lVar9;
  runtime_error *this_03;
  uint uVar10;
  uint32_t sourceX;
  size_type sVar11;
  pointer __p;
  long lVar12;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar13;
  ulong uVar14;
  uint32_t targetX;
  ulong uVar15;
  __uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *p_Var16;
  bool bVar17;
  undefined4 uVar18;
  float fVar19;
  string_view fmt;
  format_args args;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_1UL> samples;
  TransferFunctionSRGB tfSRGB;
  TransferFunctionLinear tfLinear;
  int local_ac;
  _Head_base<0UL,_basisu::Resampler_*,_false> local_a8 [2];
  ulong local_98;
  char *local_90;
  ulong local_88;
  uint local_80;
  uint local_7c;
  string local_78;
  __uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> local_58;
  _Head_base<0UL,_Image_*,_false> local_50;
  long local_48;
  long local_40;
  __uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> local_38;
  
  local_90 = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar9 = CONCAT44(in_register_00000034,targetWidth);
  local_98 = CONCAT44(local_98._4_4_,filterScale);
  aVar13 = in_R9;
  local_50._M_head_impl = &this->super_Image;
  this_01 = (ImageT<unsigned_char,_1U> *)operator_new(0x28);
  uVar8 = (uint)filter;
  ImageT(this_01,targetHeight,uVar8);
  uVar2 = *(undefined8 *)(lVar9 + 0x10);
  (this_01->super_Image).transferFunction = (int)uVar2;
  (this_01->super_Image).primaries = (int)((ulong)uVar2 >> 0x20);
  if ((uVar8 != 0) && (targetHeight != 0)) {
    uVar10 = *(uint *)(lVar9 + 8);
    local_88 = (ulong)uVar10;
    if ((uVar10 != 0) && (uVar1 = *(uint *)(lVar9 + 0xc), uVar1 != 0)) {
      uVar4 = uVar1;
      if (uVar1 < uVar10) {
        uVar4 = uVar10;
      }
      uVar10 = uVar8;
      if (uVar8 < targetHeight) {
        uVar10 = targetHeight;
      }
      if ((uVar10 < 0x4001) && (uVar4 < 0x4001)) {
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_78.field_2._M_allocated_capacity = 0;
        local_a8[0]._M_head_impl = (Resampler *)0x0;
        this_02 = (Resampler *)operator_new(0x78);
        basisu::Resampler::Resampler
                  (this_02,(int)local_88,uVar1,targetHeight,uVar8,in_R9._0_4_,0.0,1.0,local_90,
                   (Contrib_List *)0x0,(Contrib_List *)0x0,(float)local_98,(float)local_98,0.0,0.0);
        this_00._M_head_impl = local_a8[0]._M_head_impl;
        local_58._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (tuple<basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)
             (_Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)0x0;
        bVar17 = local_a8[0]._M_head_impl != (Resampler *)0x0;
        local_a8[0]._M_head_impl = this_02;
        local_80 = uVar1;
        if (bVar17) {
          basisu::Resampler::~Resampler(this_00._M_head_impl);
          operator_delete(this_00._M_head_impl,0x78);
        }
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   &local_58);
        checkResamplerStatus(local_a8[0]._M_head_impl,local_90);
        uVar14 = local_88;
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)&local_78,local_88);
        local_58._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (tuple<basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)
             &PTR_encode_001b28d8;
        local_38._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (tuple<basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)
             &PTR_encode_001b2930;
        p_Var16 = &local_58;
        if (*(int *)(lVar9 + 0x10) != 2) {
          p_Var16 = &local_38;
        }
        local_98 = (ulong)targetHeight;
        lVar12 = 0;
        local_ac = 0;
        uVar8 = 0;
        local_48 = lVar9;
        do {
          lVar9 = local_48;
          sVar11 = 0;
          local_7c = uVar8;
          do {
            uVar18 = (**(code **)((((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                     *)&(p_Var16->_M_t).
                                        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                   )->_M_t).
                                  super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                  .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl +
                                 8))((float)*(byte *)(*(long *)(lVar9 + 0x18) +
                                                     (ulong)(uint)((int)sVar11 + (int)lVar12)) *
                                     0.003921569,p_Var16);
            *(undefined4 *)(local_78._M_dataplus._M_p + sVar11 * 4) = uVar18;
            sVar11 = sVar11 + 1;
          } while (uVar14 != sVar11);
          local_40 = lVar12;
          cVar6 = basisu::Resampler::put_line((float *)local_a8[0]._M_head_impl);
          if (cVar6 == '\0') {
            checkResamplerStatus(local_a8[0]._M_head_impl,local_90);
          }
          uVar14 = (ulong)(targetHeight * local_ac);
          while( true ) {
            lVar9 = basisu::Resampler::get_line();
            _Var5._M_head_impl = local_50._M_head_impl;
            if (lVar9 == 0) break;
            uVar15 = 0;
            do {
              pCVar3 = this_01->pixels;
              fVar19 = (float)(**(code **)(((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                             *)&(p_Var16->_M_t).
                                                super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                           )->_M_t).
                                          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                          .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                          _M_head_impl)(*(undefined4 *)(lVar9 + uVar15 * 4),p_Var16)
              ;
              if (0.0 <= fVar19) {
                aVar7 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0xff;
                if (fVar19 <= 1.0) {
                  aVar7 = SUB41((int)(fVar19 * 255.0 + 0.5),0);
                }
              }
              else {
                aVar7 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0;
              }
              pCVar3[(uint)((int)uVar14 + (int)uVar15)].field_0 = aVar7;
              uVar15 = uVar15 + 1;
            } while (local_98 != uVar15);
            local_ac = local_ac + 1;
            uVar14 = uVar14 + local_98;
          }
          uVar8 = local_7c + 1;
          lVar12 = local_40 + local_88;
          uVar14 = local_88;
        } while (uVar8 != local_80);
        (local_50._M_head_impl)->_vptr_Image = (_func_int **)this_01;
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   local_a8);
        if (local_78._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_78._M_dataplus._M_p,
                          local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
        }
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)_Var5._M_head_impl;
      }
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a8[0]._M_head_impl = (Resampler *)0x4000;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = aVar13.args_;
      args.desc_ = (unsigned_long_long)local_a8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_78,(v10 *)"Image larger than max supported size of {}",fmt,args);
      std::runtime_error::runtime_error(this_03,(string *)&local_78);
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 1>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }